

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CComputeBase::Run<glcts::(anonymous_namespace)::test_api::GL>
          (CComputeBase *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *buffers_00;
  GLuint *buffers_01;
  int iVar1;
  GLuint GVar2;
  GLint GVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  long lVar6;
  runtime_error *this_01;
  size_type *psVar7;
  undefined8 *data;
  long lVar8;
  GLsizeiptr size;
  _func_int **extraout_RDX;
  _func_int **pp_Var9;
  int height;
  int width;
  CColorArray bufferTest;
  CElementArray elements;
  CColorArray bufferRef1;
  CColorArray colors;
  CColorArray coords;
  CColorArray bufferRef4;
  CColorArray bufferRef3;
  CColorArray bufferRef2;
  DrawElementsIndirectCommand indirectElements;
  DrawArraysIndirectCommand indirectArrays;
  DIResult result;
  GLuint local_448;
  GLuint local_444;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_440;
  string local_428;
  string local_408;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3e8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3d0;
  GLuint *local_3b8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3b0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_398;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_380;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined4 local_358;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338 [384];
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  long local_1a8;
  undefined4 local_1a0;
  undefined1 local_19c;
  long local_38;
  
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,(GLint *)&local_444);
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,1,(GLint *)&local_448);
  iVar1 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  if ((int)*(GLuint *)CONCAT44(extraout_var,iVar1) < (int)local_444) {
    local_444 = *(GLuint *)CONCAT44(extraout_var,iVar1);
  }
  iVar1 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  GVar2 = *(GLuint *)(CONCAT44(extraout_var_00,iVar1) + 4);
  if ((int)GVar2 < (int)local_448) {
    local_448 = GVar2;
  }
  glu::CallLogWrapper::glViewport(this_00,0,0,local_444,local_448);
  local_1b8 = (undefined1  [8])0x0;
  pp_Stack_1b0 = (_func_int **)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_3d0,(long)(int)(local_448 * local_444),(value_type *)local_1b8,
             (allocator_type *)local_338);
  local_1b8 = (undefined1  [8])0x0;
  pp_Stack_1b0 = (_func_int **)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_3e8,(long)(int)(local_448 * local_444),(value_type *)local_1b8,
             (allocator_type *)local_338);
  local_1a8 = 0x6e6f697372657623;
  local_1a0 = 0x30303420;
  pp_Stack_1b0 = (_func_int **)0xc;
  local_19c = 0;
  local_1b8 = (undefined1  [8])&local_1a8;
  plVar5 = (long *)std::__cxx11::string::append(local_1b8);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    local_338._16_8_ = *psVar7;
    local_338._24_8_ = plVar5[3];
    local_338._0_8_ = local_338 + 0x10;
  }
  else {
    local_338._16_8_ = *psVar7;
    local_338._0_8_ = (size_type *)*plVar5;
  }
  local_338._8_8_ = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8 + 1);
  }
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,0x1b32ab9);
  local_1a8 = 0x6e6f697372657623;
  local_1a0 = 0x30303420;
  pp_Stack_1b0 = (_func_int **)0xc;
  local_19c = 0;
  local_1b8 = (undefined1  [8])&local_1a8;
  plVar5 = (long *)std::__cxx11::string::append(local_1b8);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_408.field_2._M_allocated_capacity = *psVar7;
    local_408.field_2._8_8_ = plVar5[3];
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  }
  else {
    local_408.field_2._M_allocated_capacity = *psVar7;
    local_408._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_408._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8 + 1);
  }
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_338,&local_428,&local_408,false);
  this->_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  glu::CallLogWrapper::glBindAttribLocation(this_00,this->_program,0,"in_coords");
  glu::CallLogWrapper::glBindAttribLocation(this_00,this->_program,1,"in_colors");
  glu::CallLogWrapper::glLinkProgram(this_00,this->_program);
  lVar6 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_program);
  if (lVar6 == 0) {
    lVar6 = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    buffers = &this->_bufferCoords;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*buffers);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)local_3d0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3d0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    buffers_00 = &this->_bufferColors;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_00);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*buffers_00);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)local_3e8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3e8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,1,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    local_358 = 0;
    local_368 = 0;
    uStack_360 = 0;
    local_348 = 0;
    uStack_340 = 0;
    local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_428,
               (long)(int)(local_448 * local_444),(value_type_conflict4 *)local_1b8,
               (allocator_type *)local_338);
    if (local_428._M_string_length - (long)local_428._M_dataplus._M_p != 0) {
      lVar6 = (long)(local_428._M_string_length - (long)local_428._M_dataplus._M_p) >> 2;
      lVar8 = 0;
      do {
        *(int *)(local_428._M_dataplus._M_p + lVar8 * 4) = (int)lVar8;
        lVar8 = lVar8 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
    }
    buffers_01 = &this->_bufferIndirect;
    local_3b8 = buffers;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_01);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,*buffers_01);
    if (this->_drawFunc == DRAW_ARRAYS) {
      data = &local_348;
      size = 0x10;
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        goto LAB_00b9d2e3;
      }
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,local_428._M_string_length - (long)local_428._M_dataplus._M_p,
                 local_428._M_dataplus._M_p,0x88e4);
      data = &local_368;
      size = 0x14;
    }
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,size,data,0x88e4);
    local_1a8 = 0x6e6f697372657623;
    local_1a0 = 0x30333420;
    pp_Stack_1b0 = (_func_int **)0xc;
    local_19c = 0;
    local_1b8 = (undefined1  [8])&local_1a8;
    plVar5 = (long *)std::__cxx11::string::append(local_1b8);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      local_338._16_8_ = *psVar7;
      local_338._24_8_ = plVar5[3];
      local_338._0_8_ = local_338 + 0x10;
    }
    else {
      local_338._16_8_ = *psVar7;
      local_338._0_8_ = (size_type *)*plVar5;
    }
    pp_Var9 = (_func_int **)plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_338._8_8_ = pp_Var9;
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8 + 1);
      pp_Var9 = extraout_RDX;
    }
    GVar2 = DrawIndirectBase::CreateComputeProgram
                      (&this->super_DrawIndirectBase,(string *)local_338,SUB81(pp_Var9,0));
    this->_programCompute = GVar2;
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
    }
    glu::CallLogWrapper::glLinkProgram(this_00,this->_programCompute);
    lVar6 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_programCompute);
    if (lVar6 == 0) {
      lVar6 = -1;
    }
    else {
      glu::CallLogWrapper::glUseProgram(this_00,this->_programCompute);
      GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->_programCompute,"width");
      glu::CallLogWrapper::glUniform1ui(this_00,GVar3,local_444);
      GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->_programCompute,"height");
      glu::CallLogWrapper::glUniform1ui(this_00,GVar3,local_448);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*local_3b8);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,*buffers_00);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,*buffers_01);
      glu::CallLogWrapper::glDispatchCompute(this_00,local_444,local_448,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x2040);
      glu::CallLogWrapper::glUseProgram(this_00,this->_program);
      if (this->_drawFunc == DRAW_ELEMENTS) {
        glu::CallLogWrapper::glDrawElementsIndirect(this_00,0,0x1405,(void *)0x0);
      }
      else {
        if (this->_drawFunc != DRAW_ARRAYS) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"Unknown draw function!");
LAB_00b9d2e3:
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        glu::CallLogWrapper::glDrawArraysIndirect(this_00,0,(void *)0x0);
      }
      iVar4 = local_448 * local_444;
      iVar1 = iVar4 + 3;
      if (-1 < iVar4) {
        iVar1 = iVar4;
      }
      local_1b8 = (undefined1  [8])0;
      pp_Stack_1b0 = (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &local_408,(long)(iVar1 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      iVar4 = local_448 * local_444;
      iVar1 = iVar4 + 3;
      if (-1 < iVar4) {
        iVar1 = iVar4;
      }
      local_1b8 = (undefined1  [8])0x3f000000;
      pp_Stack_1b0 = (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_380,(long)(iVar1 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      iVar4 = local_448 * local_444;
      iVar1 = iVar4 + 3;
      if (-1 < iVar4) {
        iVar1 = iVar4;
      }
      local_1b8 = (undefined1  [8])0x3f00000000000000;
      pp_Stack_1b0 = (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_398,(long)(iVar1 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      iVar4 = local_448 * local_444;
      iVar1 = iVar4 + 3;
      if (-1 < iVar4) {
        iVar1 = iVar4;
      }
      local_1b8 = (undefined1  [8])&DAT_3f0000003f000000;
      pp_Stack_1b0 = (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_3b0,(long)(iVar1 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      iVar4 = local_448 * local_444;
      local_1b8 = (undefined1  [8])0x0;
      pp_Stack_1b0 = (_func_int **)0x0;
      iVar1 = iVar4 + 3;
      if (-1 < iVar4) {
        iVar1 = iVar4;
      }
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_440,(long)(iVar1 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffffffffff00);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      local_38 = 0;
      glu::CallLogWrapper::glReadPixels
                (this_00,0,0,(int)local_444 / 2,(int)local_448 / 2,0x1908,0x1406,
                 local_440.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar6 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&local_440,(int)local_444 / 2,(int)local_448 / 2,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &local_408,(int)local_444 / 2,(int)local_448 / 2);
      DIResult::sub_result((DILogger *)local_338,(DIResult *)local_1b8,lVar6);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_338,(char (*) [29])"Region 0 verification failed");
      DILogger::~DILogger((DILogger *)local_338);
      glu::CallLogWrapper::glReadPixels
                (this_00,(int)((local_444 - ((int)(local_444 + 1) >> 0x1f)) + 1) >> 1,0,
                 (int)local_444 / 2,(int)local_448 / 2,0x1908,0x1406,
                 local_440.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar6 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&local_440,(int)local_444 / 2,(int)local_448 / 2,
                         &local_380,(int)local_444 / 2,(int)local_448 / 2);
      DIResult::sub_result((DILogger *)local_338,(DIResult *)local_1b8,lVar6);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_338,(char (*) [29])"Region 1 verification failed");
      DILogger::~DILogger((DILogger *)local_338);
      glu::CallLogWrapper::glReadPixels
                (this_00,0,(int)((local_448 - ((int)(local_448 + 1) >> 0x1f)) + 1) >> 1,
                 (int)local_444 / 2,(int)local_448 / 2,0x1908,0x1406,
                 local_440.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar6 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&local_440,(int)local_444 / 2,(int)local_448 / 2,
                         &local_398,(int)local_444 / 2,(int)local_448 / 2);
      DIResult::sub_result((DILogger *)local_338,(DIResult *)local_1b8,lVar6);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_338,(char (*) [29])"Region 2 verification failed");
      DILogger::~DILogger((DILogger *)local_338);
      glu::CallLogWrapper::glReadPixels
                (this_00,(int)((local_444 - ((int)(local_444 + 1) >> 0x1f)) + 1) >> 1,
                 (int)((local_448 - ((int)(local_448 + 1) >> 0x1f)) + 1) >> 1,(int)local_444 / 2,
                 (int)local_448 / 2,0x1908,0x1406,
                 local_440.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar6 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&local_440,(int)local_444 / 2,(int)local_448 / 2,
                         &local_3b0,(int)local_444 / 2,(int)local_448 / 2);
      DIResult::sub_result((DILogger *)local_338,(DIResult *)local_1b8,lVar6);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_338,(char (*) [29])"Region 3 verification failed");
      DILogger::~DILogger((DILogger *)local_338);
      lVar6 = local_38;
      DILogger::~DILogger((DILogger *)local_1b8);
      if (local_440.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_440.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_440.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_440.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3b0.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3b0.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3b0.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3b0.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_398.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_398.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_398.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_398.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_380.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_380.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_380.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_380.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_408._M_dataplus._M_p,
                        local_408.field_2._M_allocated_capacity - (long)local_408._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_428._M_dataplus._M_p,
                      local_428.field_2._M_allocated_capacity - (long)local_428._M_dataplus._M_p);
    }
  }
  if (local_3e8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return lVar6;
}

Assistant:

long Run()
	{

		int width, height;
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &width);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 1, &height);

		width  = std::min(width, getWindowWidth());
		height = std::min(height, getWindowHeight());

		glViewport(0, 0, width, height);

		CColorArray coords(width * height, tcu::Vec4(0));
		CColorArray colors(width * height, tcu::Vec4(0));

		_program = CreateProgram(Vsh<api>(), "", Fsh<api>(), false);
		glBindAttribLocation(_program, 0, "in_coords");
		glBindAttribLocation(_program, 1, "in_colors");
		glLinkProgram(_program);
		if (!CheckProgram(_program))
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_bufferCoords);
		glBindBuffer(GL_ARRAY_BUFFER, _bufferCoords);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), 0, GL_STREAM_DRAW);

		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(0);

		glGenBuffers(1, &_bufferColors);
		glBindBuffer(GL_ARRAY_BUFFER, _bufferColors);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(colors.size() * sizeof(colors[0])), 0, GL_STREAM_DRAW);

		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(1);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };

		CElementArray elements(width * height, 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), &indirectArrays, GL_STATIC_DRAW);
		}
		break;
		case DRAW_ELEMENTS:
		{
			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements,
						 GL_STATIC_DRAW);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		_programCompute = CreateComputeProgram(Csh<api>(), false);
		glLinkProgram(_programCompute);
		if (!CheckProgram(_programCompute))
		{
			return ERROR;
		}
		glUseProgram(_programCompute);
		glUniform1ui(glGetUniformLocation(_programCompute, "width"), width);
		glUniform1ui(glGetUniformLocation(_programCompute, "height"), height);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, _bufferCoords);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, _bufferColors);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, _bufferIndirect);

		glDispatchCompute(width, height, 1);
		glMemoryBarrier(GL_COMMAND_BARRIER_BIT | GL_SHADER_STORAGE_BARRIER_BIT);

		glUseProgram(_program);

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			glDrawArraysIndirect(GL_POINTS, 0);
		}
		break;
		case DRAW_ELEMENTS:
		{
			glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, 0);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef1(width * height / 4, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		CColorArray bufferRef2(width * height / 4, tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f));
		CColorArray bufferRef3(width * height / 4, tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f));
		CColorArray bufferRef4(width * height / 4, tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f));
		CColorArray bufferTest(width * height / 4, tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef1, width / 2, height / 2))
			<< "Region 0 verification failed";

		ReadPixelsFloat<api>((width + 1) / 2, 0, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef2, width / 2, height / 2))
			<< "Region 1 verification failed";

		ReadPixelsFloat<api>(0, (height + 1) / 2, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef3, width / 2, height / 2))
			<< "Region 2 verification failed";

		ReadPixelsFloat<api>((width + 1) / 2, (height + 1) / 2, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef4, width / 2, height / 2))
			<< "Region 3 verification failed";

		return result.code();
	}